

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

int ED25519_verify(uint8_t *message,size_t message_len,uint8_t *signature,uint8_t *public_key)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  size_t i;
  long lVar6;
  long lVar7;
  bool bVar8;
  uint8_t scopy [32];
  ge_p2 R;
  uint8_t rcopy [32];
  ge_p1p1 t_1;
  fe trT;
  fe trY;
  ge_p3 u;
  fe_loose t;
  ge_p3 A;
  fe trZ;
  uint8_t h [64];
  char bslide [256];
  char aslide [256];
  uint8_t rcheck [32];
  ge_p3 A2;
  SHA512_CTX hash_ctx;
  ulong local_c28 [4];
  ge_p2 local_c08;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  ge_p1p1 local_b68;
  fe local_ac8;
  fe local_aa0;
  ge_p3 local_a78;
  fe_loose local_9d8;
  ge_p3 local_9b0;
  fe local_910;
  uchar local_8e8 [63];
  byte abStack_8a9 [256];
  byte abStack_7a9 [257];
  ge_cached local_6a8 [4];
  ge_cached local_428;
  ge_cached local_388;
  ge_cached local_2e8;
  ge_cached local_248;
  ge_p3 local_1a8;
  SHA512_CTX local_108;
  
  uVar5 = 0;
  if ((signature[0x3f] < 0x20) &&
     (iVar4 = x25519_ge_frombytes_vartime(&local_9b0,public_key), iVar4 != 0)) {
    fe_neg(&local_9d8,&local_9b0.X);
    fe_carry(&local_9b0.X,&local_9d8);
    fe_neg(&local_9d8,&local_9b0.T);
    fe_carry(&local_9b0.T,&local_9d8);
    local_b88 = *(undefined8 *)signature;
    uStack_b80 = *(undefined8 *)(signature + 8);
    local_b78 = *(undefined8 *)(signature + 0x10);
    uStack_b70 = *(undefined8 *)(signature + 0x18);
    local_c28[2] = *(undefined8 *)(signature + 0x30);
    local_c28[3] = *(undefined8 *)(signature + 0x38);
    local_c28[0] = *(ulong *)(signature + 0x20);
    local_c28[1] = *(undefined8 *)(signature + 0x28);
    lVar6 = 3;
    do {
      uVar1 = ED25519_verify::kOrder[lVar6];
      uVar2 = local_c28[lVar6];
      bVar8 = lVar6 != 0;
      lVar6 = lVar6 + -1;
    } while (uVar2 <= uVar1 && (bVar8 && uVar1 <= uVar2));
    uVar5 = 0;
    if (uVar2 <= uVar1 && uVar1 > uVar2) {
      SHA512_Init(&local_108);
      SHA512_Update(&local_108,signature,0x20);
      SHA512_Update(&local_108,public_key,0x20);
      SHA512_Update(&local_108,message,message_len);
      SHA512_Final(local_8e8,&local_108);
      x25519_sc_reduce(local_8e8);
      slide((char *)(abStack_7a9 + 1),local_8e8);
      slide((char *)(abStack_8a9 + 1),(uint8_t *)local_c28);
      x25519_ge_p3_to_cached(local_6a8,&local_9b0);
      local_a78.X.v[4] = local_9b0.X.v[4];
      local_a78.X.v[2] = local_9b0.X.v[2];
      local_a78.X.v[3] = local_9b0.X.v[3];
      local_a78.X.v[0] = local_9b0.X.v[0];
      local_a78.X.v[1] = local_9b0.X.v[1];
      local_a78.Y.v[0] = local_9b0.Y.v[0];
      local_a78.Y.v[1] = local_9b0.Y.v[1];
      local_a78.Y.v[2] = local_9b0.Y.v[2];
      local_a78.Y.v[3] = local_9b0.Y.v[3];
      local_a78.Y.v[4] = local_9b0.Y.v[4];
      local_a78.Z.v[0] = local_9b0.Z.v[0];
      local_a78.Z.v[1] = local_9b0.Z.v[1];
      local_a78.Z.v[2] = local_9b0.Z.v[2];
      local_a78.Z.v[3] = local_9b0.Z.v[3];
      local_a78.Z.v[4] = local_9b0.Z.v[4];
      ge_p2_dbl(&local_b68,(ge_p2 *)&local_a78);
      x25519_ge_p1p1_to_p3(&local_1a8,&local_b68);
      x25519_ge_add(&local_b68,&local_1a8,local_6a8);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(local_6a8 + 1,&local_a78);
      x25519_ge_add(&local_b68,&local_1a8,local_6a8 + 1);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(local_6a8 + 2,&local_a78);
      x25519_ge_add(&local_b68,&local_1a8,local_6a8 + 2);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(local_6a8 + 3,&local_a78);
      x25519_ge_add(&local_b68,&local_1a8,local_6a8 + 3);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(&local_428,&local_a78);
      x25519_ge_add(&local_b68,&local_1a8,&local_428);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(&local_388,&local_a78);
      x25519_ge_add(&local_b68,&local_1a8,&local_388);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(&local_2e8,&local_a78);
      x25519_ge_add(&local_b68,&local_1a8,&local_2e8);
      x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
      x25519_ge_p3_to_cached(&local_248,&local_a78);
      local_c08.X.v[4] = 0;
      local_c08.Y.v[3] = 0;
      local_c08.Y.v[4] = 0;
      local_c08.Y.v[1] = 0;
      local_c08.Y.v[2] = 0;
      local_c08.X.v[2] = 0;
      local_c08.X.v[3] = 0;
      local_c08.X.v[0] = 0;
      local_c08.X.v[1] = 0;
      local_c08.Y.v[0] = 1;
      local_c08.Z.v[1] = 0;
      local_c08.Z.v[2] = 0;
      local_c08.Z.v[3] = 0;
      local_c08.Z.v[4] = 0;
      local_c08.Z.v[0] = 1;
      uVar5 = 0xff;
      do {
        if ((abStack_7a9[(ulong)uVar5 + 1] != 0) || (abStack_8a9[(ulong)uVar5 + 1] != 0))
        goto LAB_001854d9;
        bVar8 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar8);
      uVar5 = 0xffffffff;
LAB_001854d9:
      if (-1 < (int)uVar5) {
        lVar6 = (ulong)uVar5 + 1;
        do {
          ge_p2_dbl(&local_b68,&local_c08);
          bVar3 = abStack_7a9[lVar6];
          if ((char)bVar3 < '\x01') {
            if ((char)bVar3 < '\0') {
              x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
              x25519_ge_sub(&local_b68,&local_a78,
                            (ge_cached *)
                            ((long)local_6a8[0].YplusX.v +
                            (ulong)((uint)(byte)-((char)bVar3 / '\x02') * 0xa0)));
            }
          }
          else {
            x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
            x25519_ge_add(&local_b68,&local_a78,
                          (ge_cached *)
                          ((long)local_6a8[0].YplusX.v + (ulong)((uint)(bVar3 >> 1) * 0xa0)));
          }
          bVar3 = abStack_8a9[lVar6];
          if ((char)bVar3 < '\x01') {
            if ((char)bVar3 < '\0') {
              x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
              bVar3 = -((char)bVar3 / '\x02');
              fe_add(&local_b68.X,&local_a78.Y,&local_a78.X);
              fe_sub(&local_b68.Y,&local_a78.Y,&local_a78.X);
              fe_mul_impl(local_910.v,(fe_limb_t *)&local_b68,Bi[bVar3].yminusx.v);
              fe_mul_impl(local_aa0.v,local_b68.Y.v,(fe_limb_t *)(Bi + bVar3));
              fe_mul_impl(local_ac8.v,Bi[bVar3].xy2d.v,local_a78.T.v);
              fe_add(&local_b68.T,&local_a78.Z,&local_a78.Z);
              fe_sub(&local_b68.X,&local_910,&local_aa0);
              fe_add(&local_b68.Y,&local_910,&local_aa0);
              fe_carry(&local_910,&local_b68.T);
              fe_sub(&local_b68.Z,&local_910,&local_ac8);
              fe_add(&local_b68.T,&local_910,&local_ac8);
            }
          }
          else {
            x25519_ge_p1p1_to_p3(&local_a78,&local_b68);
            ge_madd(&local_b68,&local_a78,Bi + (bVar3 >> 1));
          }
          x25519_ge_p1p1_to_p2(&local_c08,&local_b68);
          lVar7 = lVar6 + -1;
          bVar8 = 0 < lVar6;
          lVar6 = lVar7;
        } while (lVar7 != 0 && bVar8);
      }
      x25519_ge_tobytes((uint8_t *)local_6a8,&local_c08);
      iVar4 = CRYPTO_memcmp(local_6a8,&local_b88,0x20);
      uVar5 = (uint)(iVar4 == 0);
    }
  }
  return uVar5;
}

Assistant:

int ED25519_verify(const uint8_t *message, size_t message_len,
                   const uint8_t signature[64], const uint8_t public_key[32]) {
  ge_p3 A;
  if ((signature[63] & 224) != 0 ||
      !x25519_ge_frombytes_vartime(&A, public_key)) {
    return 0;
  }

  fe_loose t;
  fe_neg(&t, &A.X);
  fe_carry(&A.X, &t);
  fe_neg(&t, &A.T);
  fe_carry(&A.T, &t);

  uint8_t pkcopy[32];
  OPENSSL_memcpy(pkcopy, public_key, 32);
  uint8_t rcopy[32];
  OPENSSL_memcpy(rcopy, signature, 32);
  uint8_t scopy[32];
  OPENSSL_memcpy(scopy, signature + 32, 32);

  // https://tools.ietf.org/html/rfc8032#section-5.1.7 requires that s be in
  // the range [0, order) in order to prevent signature malleability.

  // kOrder is the order of Curve25519 in little-endian form.
  static const uint64_t kOrder[4] = {
      UINT64_C(0x5812631a5cf5d3ed),
      UINT64_C(0x14def9dea2f79cd6),
      0,
      UINT64_C(0x1000000000000000),
  };
  for (size_t i = 3;; i--) {
    uint64_t word = CRYPTO_load_u64_le(scopy + i * 8);
    if (word > kOrder[i]) {
      return 0;
    } else if (word < kOrder[i]) {
      break;
    } else if (i == 0) {
      return 0;
    }
  }

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, signature, 32);
  SHA512_Update(&hash_ctx, public_key, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t h[SHA512_DIGEST_LENGTH];
  SHA512_Final(h, &hash_ctx);

  x25519_sc_reduce(h);

  ge_p2 R;
  ge_double_scalarmult_vartime(&R, h, &A, scopy);

  uint8_t rcheck[32];
  x25519_ge_tobytes(rcheck, &R);

  return CRYPTO_memcmp(rcheck, rcopy, sizeof(rcheck)) == 0;
}